

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

tokenType icu_63::PluralRuleParser::getKeyType(UnicodeString *token,tokenType keyType)

{
  int8_t iVar1;
  ConstChar16Ptr local_158;
  ConstChar16Ptr local_150;
  ConstChar16Ptr local_148;
  ConstChar16Ptr local_140;
  ConstChar16Ptr local_138;
  ConstChar16Ptr local_130;
  ConstChar16Ptr local_128;
  ConstChar16Ptr local_120;
  ConstChar16Ptr local_118;
  ConstChar16Ptr local_110;
  ConstChar16Ptr local_108;
  ConstChar16Ptr local_100;
  ConstChar16Ptr local_f8;
  ConstChar16Ptr local_f0 [3];
  char16_t *local_d8;
  char16_t *local_c8;
  char16_t *local_b8;
  char16_t *local_a8;
  char16_t *local_98;
  char16_t *local_88;
  char16_t *local_78;
  char16_t *local_68;
  char16_t *local_58;
  char16_t *local_48;
  char16_t *local_38;
  char16_t *local_28;
  char16_t *local_18;
  
  if (keyType == tKeyword) {
    local_f0[0].p_ = L"n";
    iVar1 = UnicodeString::compare(token,local_f0,1);
    local_18 = local_f0[0].p_;
    if (iVar1 == '\0') {
      keyType = tVariableN;
    }
    else {
      local_f8.p_ = L"i";
      iVar1 = UnicodeString::compare(token,&local_f8,1);
      local_28 = local_f8.p_;
      if (iVar1 == '\0') {
        keyType = tVariableI;
      }
      else {
        local_100.p_ = L"f";
        iVar1 = UnicodeString::compare(token,&local_100,1);
        local_38 = local_100.p_;
        if (iVar1 == '\0') {
          keyType = tVariableF;
        }
        else {
          local_108.p_ = L"t";
          iVar1 = UnicodeString::compare(token,&local_108,1);
          local_48 = local_108.p_;
          if (iVar1 == '\0') {
            keyType = tVariableT;
          }
          else {
            local_110.p_ = L"v";
            iVar1 = UnicodeString::compare(token,&local_110,1);
            local_58 = local_110.p_;
            if (iVar1 == '\0') {
              keyType = tVariableV;
            }
            else {
              local_118.p_ = L"is";
              iVar1 = UnicodeString::compare(token,&local_118,2);
              local_68 = local_118.p_;
              if (iVar1 == '\0') {
                keyType = tIs;
              }
              else {
                local_120.p_ = L"and";
                iVar1 = UnicodeString::compare(token,&local_120,3);
                local_78 = local_120.p_;
                if (iVar1 == '\0') {
                  keyType = tAnd;
                }
                else {
                  local_128.p_ = L"in";
                  iVar1 = UnicodeString::compare(token,&local_128,2);
                  local_88 = local_128.p_;
                  if (iVar1 == '\0') {
                    keyType = tIn;
                  }
                  else {
                    local_130.p_ = (char16_t *)PK_WITHIN;
                    iVar1 = UnicodeString::compare(token,&local_130,6);
                    local_98 = local_130.p_;
                    if (iVar1 == '\0') {
                      keyType = tWithin;
                    }
                    else {
                      local_138.p_ = L"not";
                      iVar1 = UnicodeString::compare(token,&local_138,3);
                      local_a8 = local_138.p_;
                      if (iVar1 == '\0') {
                        keyType = tNot;
                      }
                      else {
                        local_140.p_ = L"mod";
                        iVar1 = UnicodeString::compare(token,&local_140,3);
                        local_b8 = local_140.p_;
                        if (iVar1 == '\0') {
                          keyType = tMod;
                        }
                        else {
                          local_148.p_ = L"or";
                          iVar1 = UnicodeString::compare(token,&local_148,2);
                          local_c8 = local_148.p_;
                          if (iVar1 == '\0') {
                            keyType = tOr;
                          }
                          else {
                            local_150.p_ = (char16_t *)PK_DECIMAL;
                            iVar1 = UnicodeString::compare(token,&local_150,7);
                            local_d8 = local_150.p_;
                            if (iVar1 == '\0') {
                              keyType = tDecimal;
                            }
                            else {
                              local_158.p_ = (char16_t *)PK_INTEGER;
                              iVar1 = UnicodeString::compare(token,&local_158,7);
                              keyType = tKeyword;
                              if (iVar1 == '\0') {
                                keyType = tInteger;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return keyType;
}

Assistant:

tokenType
PluralRuleParser::getKeyType(const UnicodeString &token, tokenType keyType)
{
    if (keyType != tKeyword) {
        return keyType;
    }

    if (0 == token.compare(PK_VAR_N, 1)) {
        keyType = tVariableN;
    } else if (0 == token.compare(PK_VAR_I, 1)) {
        keyType = tVariableI;
    } else if (0 == token.compare(PK_VAR_F, 1)) {
        keyType = tVariableF;
    } else if (0 == token.compare(PK_VAR_T, 1)) {
        keyType = tVariableT;
    } else if (0 == token.compare(PK_VAR_V, 1)) {
        keyType = tVariableV;
    } else if (0 == token.compare(PK_IS, 2)) {
        keyType = tIs;
    } else if (0 == token.compare(PK_AND, 3)) {
        keyType = tAnd;
    } else if (0 == token.compare(PK_IN, 2)) {
        keyType = tIn;
    } else if (0 == token.compare(PK_WITHIN, 6)) {
        keyType = tWithin;
    } else if (0 == token.compare(PK_NOT, 3)) {
        keyType = tNot;
    } else if (0 == token.compare(PK_MOD, 3)) {
        keyType = tMod;
    } else if (0 == token.compare(PK_OR, 2)) {
        keyType = tOr;
    } else if (0 == token.compare(PK_DECIMAL, 7)) {
        keyType = tDecimal;
    } else if (0 == token.compare(PK_INTEGER, 7)) {
        keyType = tInteger;
    }
    return keyType;
}